

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::DOMRangeImpl(DOMRangeImpl *this,DOMRangeImpl *other)

{
  MemoryManager *pMVar1;
  
  (this->super_DOMRange)._vptr_DOMRange = (_func_int **)&PTR__DOMRangeImpl_003feb10;
  this->fStartContainer = other->fStartContainer;
  this->fStartOffset = other->fStartOffset;
  this->fEndContainer = other->fEndContainer;
  this->fEndOffset = other->fEndOffset;
  this->fCollapsed = other->fCollapsed;
  this->fDocument = other->fDocument;
  this->fDetached = other->fDetached;
  pMVar1 = other->fMemoryManager;
  this->fRemoveChild = other->fRemoveChild;
  this->fMemoryManager = pMVar1;
  return;
}

Assistant:

DOMRangeImpl::DOMRangeImpl(const DOMRangeImpl& other)
:   DOMRange(other),
    fStartContainer(other.fStartContainer),
    fStartOffset(other.fStartOffset),
    fEndContainer(other.fEndContainer),
    fEndOffset(other.fEndOffset),
    fCollapsed(other.fCollapsed),
    fDocument(other.fDocument),
    fDetached(other.fDetached),
    fRemoveChild(other.fRemoveChild),
    fMemoryManager(other.fMemoryManager)
{
}